

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pushdown_unnest.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::FilterPushdown::PushdownUnnest
          (FilterPushdown *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var1;
  undefined8 uVar2;
  FilterResult FVar3;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__range2;
  pointer pLVar4;
  LogicalUnnest *pLVar5;
  type pFVar6;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *__args;
  reference pvVar7;
  LogicalEmptyResult *this_00;
  bool bVar8;
  ClientContext *in_RDX;
  __node_base *p_Var9;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var10;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  remain_expressions;
  FilterPushdown child_pushdown;
  undefined1 local_1b0 [40];
  __buckets_ptr local_188;
  size_type sStack_180;
  __node_base local_178;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_170
  ;
  __buckets_ptr local_168;
  size_type sStack_160;
  _Hash_node_base *local_158;
  undefined1 local_150 [40];
  _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_128;
  _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_f0;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>_>
  local_b8;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>_>
  local_88;
  vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
  local_48;
  
  local_1b0._8_8_ = in_RDX;
  pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)in_RDX);
  pLVar5 = LogicalOperator::Cast<duckdb::LogicalUnnest>(pLVar4);
  FilterPushdown((FilterPushdown *)local_150,
                 (Optimizer *)
                 (op->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
                 *(bool *)&op[0x20].
                           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl);
  local_188 = (__buckets_ptr)0x0;
  sStack_180 = 0;
  local_178._M_nxt = (_Hash_node_base *)0x0;
  _Var10._M_head_impl =
       op[0x21].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  _Var1._M_head_impl =
       op[0x22].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  local_170 = op;
  do {
    if (_Var10._M_head_impl == _Var1._M_head_impl) {
      GenerateFilters((FilterPushdown *)local_150);
      pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)local_1b0._8_8_);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](&pLVar4->children,0);
      local_1b0._32_8_ =
           (pvVar7->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (pvVar7->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      Rewrite((FilterPushdown *)local_1b0,
              (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)local_150);
      pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)local_1b0._8_8_);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](&pLVar4->children,0);
      uVar2 = local_1b0._0_8_;
      local_1b0._0_8_ = (LogicalOperator *)0x0;
      _Var10._M_head_impl =
           (pvVar7->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (pvVar7->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (LogicalOperator *)uVar2;
      if (_Var10._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(_Var10._M_head_impl)->_vptr_LogicalOperator + 8))();
      }
      if ((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           )local_1b0._0_8_ != (LogicalOperator *)0x0) {
        (**(code **)(*(long *)local_1b0._0_8_ + 8))();
      }
      local_1b0._0_8_ =
           (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            )0x0;
      if ((LogicalOperator *)local_1b0._32_8_ != (LogicalOperator *)0x0) {
        (*(*(_func_int ***)local_1b0._32_8_)[1])();
      }
      local_1b0._32_8_ = (pointer)0x0;
      pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)local_1b0._8_8_);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](&pLVar4->children,0);
      pLVar4 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(pvVar7);
      if (pLVar4->type == LOGICAL_EMPTY_RESULT) {
        this_00 = (LogicalEmptyResult *)operator_new(0x98);
        local_1b0._0_8_ =
             (((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                *)&(((enable_shared_from_this<duckdb::ClientContext> *)local_1b0._8_8_)->
                   __weak_this_).internal.
                   super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>)._M_head_impl;
        (((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           *)&(((enable_shared_from_this<duckdb::ClientContext> *)local_1b0._8_8_)->__weak_this_).
              internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>)._M_head_impl =
             (LogicalOperator *)0x0;
        LogicalEmptyResult::LogicalEmptyResult
                  (this_00,(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)local_1b0);
LAB_01782ab1:
        if ((LogicalOperator *)local_1b0._0_8_ != (LogicalOperator *)0x0) {
          (*(*(_func_int ***)local_1b0._0_8_)[1])();
        }
        this->optimizer = (Optimizer *)this_00;
      }
      else {
        local_1b0._24_8_ =
             (((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                *)&(((enable_shared_from_this<duckdb::ClientContext> *)local_1b0._8_8_)->
                   __weak_this_).internal.
                   super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>)._M_head_impl;
        (((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           *)&(((enable_shared_from_this<duckdb::ClientContext> *)local_1b0._8_8_)->__weak_this_).
              internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>)._M_head_impl =
             (LogicalOperator *)0x0;
        local_168 = local_188;
        sStack_160 = sStack_180;
        local_158 = local_178._M_nxt;
        local_178._M_nxt = (_Hash_node_base *)0x0;
        local_188 = (__buckets_ptr)0x0;
        sStack_180 = 0;
        AddLogicalFilter(this,local_170,
                         (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          *)(local_1b0 + 0x18));
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)&local_168);
        if ((LogicalOperator *)local_1b0._24_8_ != (LogicalOperator *)0x0) {
          (*(*(_func_int ***)local_1b0._24_8_)[1])();
        }
        local_1b0._24_8_ = (pointer)0x0;
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&local_188);
      ::std::
      vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
      ::~vector(&local_48);
      ::std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>_>
      ::~_Rb_tree(&local_88);
      ::std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>_>
      ::~_Rb_tree(&local_b8);
      ::std::
      _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_f0);
      ::std::
      _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_128);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)(local_150 + 0x10));
      return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
             this;
    }
    pFVar6 = unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
             ::operator*((unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                          *)_Var10._M_head_impl);
    p_Var9 = &(pFVar6->bindings)._M_h._M_before_begin;
    bVar8 = true;
    do {
      p_Var9 = p_Var9->_M_nxt;
      if (p_Var9 == (__node_base *)0x0) goto LAB_017828ab;
    } while (p_Var9[1]._M_nxt != (_Hash_node_base *)pLVar5->unnest_index);
    bVar8 = false;
LAB_017828ab:
    __args = &pFVar6->filter;
    if (bVar8) {
      local_1b0._16_8_ =
           (__args->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (__args->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      FVar3 = AddFilter((FilterPushdown *)local_150,
                        (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)(local_1b0 + 0x10));
      if ((Expression *)local_1b0._16_8_ != (Expression *)0x0) {
        (**(code **)((long)((BaseExpression *)local_1b0._16_8_)->_vptr_BaseExpression + 8))();
      }
      local_1b0._16_8_ = (pointer)0x0;
      if (FVar3 == UNSATISFIABLE) {
        this_00 = (LogicalEmptyResult *)operator_new(0x98);
        local_1b0._0_8_ =
             (((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                *)&(((enable_shared_from_this<duckdb::ClientContext> *)local_1b0._8_8_)->
                   __weak_this_).internal.
                   super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>)._M_head_impl;
        (((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           *)&(((enable_shared_from_this<duckdb::ClientContext> *)local_1b0._8_8_)->__weak_this_).
              internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>)._M_head_impl =
             (LogicalOperator *)0x0;
        LogicalEmptyResult::LogicalEmptyResult
                  (this_00,(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)local_1b0);
        goto LAB_01782ab1;
      }
    }
    else {
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_188,__args);
    }
    _Var10._M_head_impl = (LogicalOperator *)&(_Var10._M_head_impl)->type;
  } while( true );
}

Assistant:

unique_ptr<LogicalOperator> FilterPushdown::PushdownUnnest(unique_ptr<LogicalOperator> op) {
	D_ASSERT(op->type == LogicalOperatorType::LOGICAL_UNNEST);
	auto &unnest = op->Cast<LogicalUnnest>();
	// push filter through logical projection
	// all the BoundColumnRefExpressions in the filter should refer to the LogicalProjection
	// we can rewrite them by replacing those references with the expression of the LogicalProjection node
	FilterPushdown child_pushdown(optimizer, convert_mark_joins);
	// There are some expressions can not be pushed down. We should keep them
	// and add an extra filter operator.
	vector<unique_ptr<Expression>> remain_expressions;
	for (auto &filter : filters) {
		auto &f = *filter;
		auto can_push = true;
		for (auto &binding : f.bindings) {
			if (binding == unnest.unnest_index) {
				can_push = false;
				break;
			}
		}
		// if the expression index table index is the unnest index, then the filter is on the
		// unnest, and it should not be pushed down.
		if (!can_push) {
			// We can't push down related expressions if the column in the
			// expression is generated by the functions which have side effects
			remain_expressions.push_back(std::move(f.filter));
		} else {
			// add the filter to the child pushdown
			if (child_pushdown.AddFilter(std::move(f.filter)) == FilterResult::UNSATISFIABLE) {
				// filter statically evaluates to false, strip tree
				return make_uniq<LogicalEmptyResult>(std::move(op));
			}
		}
	}
	child_pushdown.GenerateFilters();
	// now push into children
	op->children[0] = child_pushdown.Rewrite(std::move(op->children[0]));
	if (op->children[0]->type == LogicalOperatorType::LOGICAL_EMPTY_RESULT) {
		// child returns an empty result: generate an empty result here too
		return make_uniq<LogicalEmptyResult>(std::move(op));
	}
	return AddLogicalFilter(std::move(op), std::move(remain_expressions));
}